

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

TString * str_checkname(LexState *ls)

{
  long in_RDI;
  TString *ts;
  int in_stack_ffffffffffffffec;
  LexState *in_stack_fffffffffffffff0;
  TString *pTVar1;
  
  check(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  pTVar1 = *(TString **)(in_RDI + 0x18);
  luaX_next((LexState *)0x118270);
  return pTVar1;
}

Assistant:

static TString*str_checkname(LexState*ls){
TString*ts;
check(ls,TK_NAME);
ts=ls->t.seminfo.ts;
luaX_next(ls);
return ts;
}